

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 __s;
  bool bVar1;
  int iVar2;
  char *__s_00;
  allocator<char> local_479;
  IFileReaderFactory local_478 [4];
  allocator<char> local_451;
  string local_450 [32];
  string local_430 [3];
  undefined1 local_3c8 [104];
  undefined1 local_360 [104];
  undefined1 local_2f8 [104];
  undefined1 local_290 [104];
  undefined1 local_228 [104];
  undefined1 local_1c0 [112];
  string local_150 [32];
  string local_130 [8];
  Result_t result;
  FileReaderFactory local_c8 [8];
  FileReaderFactory defaultFactory;
  IFileReaderFactory local_bc;
  EssenceType_t EssenceType;
  undefined1 local_a8 [8];
  CommandOptions Options;
  char **argv_local;
  int argc_local;
  
  Options.prefix_buffer.field_2._8_8_ = argv;
  CommandOptions::CommandOptions((CommandOptions *)local_a8,argc,argv);
  if ((Options.verbose_flag & 1U) != 0) {
    banner(_stdout);
  }
  if ((Options._6_1_ & 1) != 0) {
    usage(_stdout);
  }
  if (((Options.verbose_flag & 1U) != 0) || ((Options._6_1_ & 1) != 0)) {
    argv_local._4_4_ = 0;
    local_bc._vptr_IFileReaderFactory._4_4_ = 1;
    goto LAB_001151e1;
  }
  if ((local_a8[0] & 1U) != 0) {
    fprintf(_stderr,"There was a problem. Type %s -h for help.\n",PROGRAM_NAME);
    argv_local._4_4_ = 3;
    local_bc._vptr_IFileReaderFactory._4_4_ = 1;
    goto LAB_001151e1;
  }
  Kumu::FileReaderFactory::FileReaderFactory(local_c8);
  __s = Options.key_id_value._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_150,(char *)__s,(allocator<char> *)(local_1c0 + 0x6f));
  ASDCP::EssenceType(local_130,(EssenceType_t *)local_150,&local_bc);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)(local_1c0 + 0x6f));
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_130);
  if (iVar2 < 0) goto LAB_001150d5;
  switch((uint)local_bc._vptr_IFileReaderFactory) {
  case 9:
    read_JP2K_file((CommandOptions *)local_1c0,(IFileReaderFactory *)local_a8);
    Kumu::Result_t::operator=((Result_t *)local_130,(Result_t *)local_1c0);
    Kumu::Result_t::~Result_t((Result_t *)local_1c0);
    break;
  case 10:
  case 0xb:
    read_PCM_file((CommandOptions *)local_290,(IFileReaderFactory *)local_a8);
    Kumu::Result_t::operator=((Result_t *)local_130,(Result_t *)local_290);
    Kumu::Result_t::~Result_t((Result_t *)local_290);
    break;
  case 0xc:
    read_timed_text_file((CommandOptions *)local_2f8,(IFileReaderFactory *)local_a8);
    Kumu::Result_t::operator=((Result_t *)local_130,(Result_t *)local_2f8);
    Kumu::Result_t::~Result_t((Result_t *)local_2f8);
    break;
  case 0xd:
    if ((uint)Options.extension == 0) {
      read_isxd_file((CommandOptions *)local_3c8,(IFileReaderFactory *)local_a8);
      Kumu::Result_t::operator=((Result_t *)local_130,(Result_t *)local_3c8);
      Kumu::Result_t::~Result_t((Result_t *)local_3c8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_450,(char *)Options.key_id_value._8_8_,&local_451);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_478,(char *)Options.edit_rate,&local_479);
      extract_generic_stream_partition_payload
                (local_430,(ui32_t)local_450,(string *)(ulong)(uint)Options.extension,local_478);
      Kumu::Result_t::operator=((Result_t *)local_130,(Result_t *)local_430);
      Kumu::Result_t::~Result_t((Result_t *)local_430);
      std::__cxx11::string::~string((string *)local_478);
      std::allocator<char>::~allocator(&local_479);
      std::__cxx11::string::~string(local_450);
      std::allocator<char>::~allocator(&local_451);
    }
    break;
  case 0xe:
    read_ACES_file((CommandOptions *)local_228,(IFileReaderFactory *)local_a8);
    Kumu::Result_t::operator=((Result_t *)local_130,(Result_t *)local_228);
    Kumu::Result_t::~Result_t((Result_t *)local_228);
    break;
  case 0xf:
    read_iab_file((CommandOptions *)local_360,(IFileReaderFactory *)local_a8);
    Kumu::Result_t::operator=((Result_t *)local_130,(Result_t *)local_360);
    Kumu::Result_t::~Result_t((Result_t *)local_360);
    break;
  default:
    fprintf(_stderr,"%s: Unknown file type (%d), not AS-02 essence.\n",Options.key_id_value._8_8_,
            (ulong)(uint)local_bc._vptr_IFileReaderFactory);
    argv_local._4_4_ = 5;
    goto LAB_001151ad;
  }
LAB_001150d5:
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_130);
  if (iVar2 < 0) {
    fputs("Program stopped on error.\n",_stderr);
    bVar1 = Kumu::Result_t::operator!=((Result_t *)local_130,(Result_t *)Kumu::RESULT_FAIL);
    if (bVar1) {
      __s_00 = Kumu::Result_t::operator_cast_to_char_((Result_t *)local_130);
      fputs(__s_00,_stderr);
      fputc(10,_stderr);
    }
    argv_local._4_4_ = 1;
  }
  else {
    argv_local._4_4_ = 0;
  }
LAB_001151ad:
  local_bc._vptr_IFileReaderFactory._4_4_ = 1;
  Kumu::Result_t::~Result_t((Result_t *)local_130);
  Kumu::FileReaderFactory::~FileReaderFactory(local_c8);
LAB_001151e1:
  CommandOptions::~CommandOptions((CommandOptions *)local_a8);
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, const char** argv)
{
  CommandOptions Options(argc, argv);

  if ( Options.version_flag )
    banner();

  if ( Options.help_flag )
    usage();

  if ( Options.version_flag || Options.help_flag )
    return 0;

  if ( Options.error_flag )
    {
      fprintf(stderr, "There was a problem. Type %s -h for help.\n", PROGRAM_NAME);
      return 3;
    }

  EssenceType_t EssenceType;
  Kumu::FileReaderFactory defaultFactory;
  Result_t result = ASDCP::EssenceType(Options.input_filename, EssenceType, defaultFactory);

  if ( ASDCP_SUCCESS(result) )
    {
      switch ( EssenceType )
	{
	case ESS_AS02_JPEG_2000:
	  result = read_JP2K_file(Options, defaultFactory);
	  break;
	//PB
	case ESS_AS02_ACES:
	  result = read_ACES_file(Options, defaultFactory);
	  break;
	//--
	case ESS_AS02_PCM_24b_48k:
	case ESS_AS02_PCM_24b_96k:
	  result = read_PCM_file(Options, defaultFactory);
	  break;

	case ESS_AS02_TIMED_TEXT:
	  result = read_timed_text_file(Options, defaultFactory);
	  break;

    case ESS_AS02_IAB:
	  result = read_iab_file(Options, defaultFactory);
	  break;

	case ESS_AS02_ISXD:
	  if ( Options.g_stream_sid == 0 )
	    {
          result = read_isxd_file(Options, defaultFactory);
	    }
	  else
	    {
	      result = extract_generic_stream_partition_payload(Options.input_filename,
								Options.g_stream_sid,
                                Options.file_prefix, defaultFactory);
	    }
	  break;

	default:
	  fprintf(stderr, "%s: Unknown file type (%d), not AS-02 essence.\n", Options.input_filename, EssenceType);
	  return 5;
	}
    }

  if ( ASDCP_FAILURE(result) )
    {
      fputs("Program stopped on error.\n", stderr);

      if ( result != RESULT_FAIL )
	{
	  fputs(result, stderr);
	  fputc('\n', stderr);
	}

      return 1;
    }

  return 0;
}